

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::SSARewriter::FinalizePhiCandidate(SSARewriter *this,PhiCandidate *phi_candidate)

{
  uint32_t *puVar1;
  pointer puVar2;
  bool bVar3;
  uint32_t uVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *bb;
  uint32_t *puVar7;
  ulong uVar8;
  PhiCandidate *local_38;
  
  local_38 = phi_candidate;
  if ((phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (phi_candidate->phi_args_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("phi_candidate->phi_args().size() > 0 && \"Phi candidate should have arguments\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                  ,0x25f,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
  }
  pCVar5 = Pass::cfg(&this->pass_->super_Pass);
  uVar4 = BasicBlock::id(phi_candidate->bb_);
  pvVar6 = CFG::preds(pCVar5,uVar4);
  puVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = 0;
  for (puVar7 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    uVar4 = *puVar7;
    pCVar5 = Pass::cfg(&this->pass_->super_Pass);
    bb = CFG::block(pCVar5,uVar4);
    puVar2 = (phi_candidate->phi_args_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar2[uVar8] == 0) {
      bVar3 = IsBlockSealed(this,bb);
      if (bVar3) {
        uVar4 = GetReachingDef(this,phi_candidate->var_id_,bb);
      }
      else {
        uVar4 = MemPass::GetUndefVal(this->pass_,phi_candidate->var_id_);
      }
      puVar2[uVar8] = uVar4;
    }
    uVar8 = (ulong)((int)uVar8 + 1);
  }
  phi_candidate->is_complete_ = true;
  uVar4 = TryRemoveTrivialPhi(this,phi_candidate);
  if (uVar4 == phi_candidate->result_id_) {
    if (phi_candidate->copy_of_ != 0) {
      __assert_fail("!phi_candidate->copy_of() && \"A completed Phi cannot be trivial.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ssa_rewrite_pass.cpp"
                    ,0x276,"void spvtools::opt::SSARewriter::FinalizePhiCandidate(PhiCandidate *)");
    }
    std::
    vector<spvtools::opt::SSARewriter::PhiCandidate_*,_std::allocator<spvtools::opt::SSARewriter::PhiCandidate_*>_>
    ::push_back(&this->phis_to_generate_,&local_38);
  }
  return;
}

Assistant:

void SSARewriter::FinalizePhiCandidate(PhiCandidate* phi_candidate) {
  assert(phi_candidate->phi_args().size() > 0 &&
         "Phi candidate should have arguments");

  uint32_t ix = 0;
  for (uint32_t pred : pass_->cfg()->preds(phi_candidate->bb()->id())) {
    BasicBlock* pred_bb = pass_->cfg()->block(pred);
    uint32_t& arg_id = phi_candidate->phi_args()[ix++];
    if (arg_id == 0) {
      // If |pred_bb| is still not sealed, it means it's unreachable. In this
      // case, we just use Undef as an argument.
      arg_id = IsBlockSealed(pred_bb)
                   ? GetReachingDef(phi_candidate->var_id(), pred_bb)
                   : pass_->GetUndefVal(phi_candidate->var_id());
    }
  }

  // This candidate is now completed.
  phi_candidate->MarkComplete();

  // If |phi_candidate| is not trivial, add it to the list of Phis to
  // generate.
  if (TryRemoveTrivialPhi(phi_candidate) == phi_candidate->result_id()) {
    // If we could not remove |phi_candidate|, it means that it is complete
    // and not trivial. Add it to the list of Phis to generate.
    assert(!phi_candidate->copy_of() && "A completed Phi cannot be trivial.");
    phis_to_generate_.push_back(phi_candidate);
  }
}